

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_header_mode(pt_event_decoder *decoder,pt_packet_mode *packet)

{
  pt_exec_mode pVar1;
  pt_event *ppVar2;
  pt_event *ev;
  pt_packet_mode *packet_local;
  pt_event_decoder *decoder_local;
  
  if ((decoder == (pt_event_decoder *)0x0) || (packet == (pt_packet_mode *)0x0)) {
    return -1;
  }
  if (packet->leaf == pt_mol_exec) {
    if ((decoder->field_0x72c & 1) == 0) {
      decoder->field_0x72c = decoder->field_0x72c & 0xfe | 1;
      decoder->field_0x72c = decoder->field_0x72c & 0xfd | (*(byte *)&packet->bits >> 2 & 1) << 1;
      decoder->field_0x72c = decoder->field_0x72c & 0xfb | (*(byte *)&packet->bits >> 1 & 1) << 2;
      decoder->field_0x72c = decoder->field_0x72c & 0xf7 | (*(byte *)&packet->bits & 1) << 3;
    }
    else {
      if (((*(byte *)&(decoder->flags).variant >> 1 & 1) != 0) &&
         (((byte)decoder->field_0x72c >> 1 & 1) != (*(byte *)&packet->bits >> 2 & 1))) {
        return -0x16;
      }
      if (((byte)decoder->field_0x72c >> 2 & 1) != (*(byte *)&packet->bits >> 1 & 1)) {
        return -0x16;
      }
      if (((byte)decoder->field_0x72c >> 3 & 1) != (*(byte *)&packet->bits & 1)) {
        return -0x16;
      }
    }
    ppVar2 = pt_evq_enqueue(&decoder->evq,1);
    if (ppVar2 == (pt_event *)0x0) {
      return -9;
    }
    ppVar2->field_0x4 = ppVar2->field_0x4 & 0xfd | 2;
    ppVar2->type = ptev_exec_mode;
    pVar1 = pt_get_exec_mode(&(packet->bits).exec);
    (ppVar2->variant).exec_mode.mode = pVar1;
    if ((*(byte *)&(decoder->flags).variant >> 1 & 1) != 0) {
      ppVar2 = pt_evq_enqueue(&decoder->evq,1);
      if (ppVar2 == (pt_event *)0x0) {
        return -9;
      }
      ppVar2->field_0x4 = ppVar2->field_0x4 & 0xfd | 2;
      ppVar2->type = ptev_iflags;
      (ppVar2->variant).pwre.state =
           (ppVar2->variant).pwre.state & 0xfe | *(byte *)&packet->bits >> 2 & 1;
    }
  }
  else if (packet->leaf == pt_mol_tsx) {
    ppVar2 = pt_evq_enqueue(&decoder->evq,1);
    if (ppVar2 == (pt_event *)0x0) {
      return -9;
    }
    ppVar2->field_0x4 = ppVar2->field_0x4 & 0xfd | 2;
    ppVar2->type = ptev_tsx;
    (ppVar2->variant).ptwrite.size =
         (ppVar2->variant).ptwrite.size & 0xfe | *(byte *)&packet->bits & 1;
    (ppVar2->variant).ptwrite.size =
         (ppVar2->variant).ptwrite.size & 0xfd | (*(byte *)&packet->bits >> 1 & 1) << 1;
  }
  return 0;
}

Assistant:

static int pt_evt_header_mode(struct pt_event_decoder *decoder,
			      const struct pt_packet_mode *packet)
{
	struct pt_event *ev;

	if (!decoder || !packet)
		return -pte_internal;

	switch (packet->leaf) {
	case pt_mol_exec:
		/* If our mode.exec state is already initialized, we can use
		 * the status update packet to diagnose inconsistencies.
		 *
		 * Use it to initialize our state, otherwise.
		 */
		if (decoder->mode_exec_valid) {
			/* The iflag status may be inconsistent unless Event
			 * Tracing is enabled as we would not get all updates.
			 */
			if (decoder->flags.variant.event.enable_iflags_events &&
			    (decoder->iflag != packet->bits.exec.iflag))
				return -pte_bad_status_update;

			if (decoder->csd != packet->bits.exec.csd)
				return -pte_bad_status_update;

			if (decoder->csl != packet->bits.exec.csl)
				return -pte_bad_status_update;
		} else {
			decoder->mode_exec_valid = 1;
			decoder->iflag = packet->bits.exec.iflag;
			decoder->csd = packet->bits.exec.csd;
			decoder->csl = packet->bits.exec.csl;
		}

		ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
		if (!ev)
			return -pte_nomem;

		ev->status_update = 1;
		ev->type = ptev_exec_mode;
		ev->variant.exec_mode.mode =
			pt_get_exec_mode(&packet->bits.exec);

		if (decoder->flags.variant.event.enable_iflags_events) {
			ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
			if (!ev)
				return -pte_nomem;

			ev->status_update = 1;
			ev->type = ptev_iflags;
			ev->variant.iflags.iflag = packet->bits.exec.iflag;
		}
		break;

	case pt_mol_tsx:
		ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
		if (!ev)
			return -pte_nomem;

		ev->status_update = 1;
		ev->type = ptev_tsx;
		ev->variant.tsx.speculative = packet->bits.tsx.intx;
		ev->variant.tsx.aborted = packet->bits.tsx.abrt;
		break;
	}

	return 0;
}